

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

int64 strtoi64(char *str,uint len)

{
  bool bVar1;
  uint local_2c;
  char ch_1;
  char ch;
  long lStack_28;
  int i;
  int64 mult;
  int64 retval;
  char *pcStack_10;
  uint len_local;
  char *str_local;
  
  mult = 0;
  lStack_28 = 1;
  local_2c = 0;
  retval._4_4_ = len;
  pcStack_10 = str;
  while( true ) {
    bVar1 = false;
    if (retval._4_4_ != 0) {
      bVar1 = *pcStack_10 == ' ';
    }
    if (!bVar1) break;
    pcStack_10 = pcStack_10 + 1;
    retval._4_4_ = retval._4_4_ - 1;
  }
  if ((retval._4_4_ != 0) && (*pcStack_10 == '-')) {
    lStack_28 = -1;
    pcStack_10 = pcStack_10 + 1;
    retval._4_4_ = retval._4_4_ - 1;
  }
  for (; ((local_2c < retval._4_4_ && ('/' < pcStack_10[(int)local_2c])) &&
         (pcStack_10[(int)local_2c] < ':')); local_2c = local_2c + 1) {
  }
  while (local_2c = local_2c - 1, -1 < (int)local_2c) {
    mult = (pcStack_10[(int)local_2c] + -0x30) * lStack_28 + mult;
    lStack_28 = lStack_28 * 10;
  }
  return mult;
}

Assistant:

static inline int64 strtoi64(const char *str, unsigned int len)
{
    int64 retval = 0;
    int64 mult = 1;
    int i = 0;

    while ((len) && (*str == ' '))
    {
        str++;
        len--;
    } // while

    if ((len) && (*str == '-'))
    {
        mult = -1;
        str++;
        len--;
    } // if

    while (i < len)
    {
        const char ch = str[i];
        if ((ch < '0') || (ch > '9'))
            break;
        i++;
    } // while

    while (--i >= 0)
    {
        const char ch = str[i];
        retval += ((int64) (ch - '0')) * mult;
        mult *= 10;
    } // while

    return retval;
}